

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O0

double EDLines::ComputeMinDistance(double x1,double y1,double a,double b,int invert)

{
  double dVar1;
  double c_1;
  double d_1;
  double c;
  double d;
  double y2;
  double x2;
  int invert_local;
  double b_local;
  double a_local;
  double y1_local;
  double x1_local;
  
  if (invert == 0) {
    if ((b != 0.0) || (d = a, y2 = x1, NAN(b))) {
      y2 = (a - (-(-1.0 / b) * x1 + y1)) / (-1.0 / b - b);
      d = b * y2 + a;
    }
  }
  else if ((b != 0.0) || (d = y1, y2 = a, NAN(b))) {
    d = (a - (-(-1.0 / b) * y1 + x1)) / (-1.0 / b - b);
    y2 = b * d + a;
  }
  dVar1 = sqrt((x1 - y2) * (x1 - y2) + (y1 - d) * (y1 - d));
  return dVar1;
}

Assistant:

double EDLines::ComputeMinDistance(double x1, double y1, double a, double b, int invert)
{
	double x2, y2;

	if (invert == 0) {
		if (b == 0) {
			x2 = x1;
			y2 = a;

		}
		else {
			// Let the line passing through (x1, y1) that is perpendicular to a+bx be c+dx
			double d = -1.0 / (b);
			double c = y1 - d*x1;

			x2 = (a - c) / (d - b);
			y2 = a + b*x2;
		} //end-else

	}
	else {
		/// invert = 1
		if (b == 0) {
			x2 = a;
			y2 = y1;

		}
		else {
			// Let the line passing through (x1, y1) that is perpendicular to a+by be c+dy
			double d = -1.0 / (b);
			double c = x1 - d*y1;

			y2 = (a - c) / (d - b);
			x2 = a + b*y2;
		} //end-else
	} //end-else

	return sqrt((x1 - x2)*(x1 - x2) + (y1 - y2)*(y1 - y2));
}